

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitalPhaseLockedLoop.hpp
# Opt level: O3

void __thiscall Storage::Tape::Acorn::Shifter::Shifter(Shifter *this)

{
  long lVar1;
  
  (this->pll_).bit_handler_ = this;
  lVar1 = 0x10;
  do {
    *(undefined8 *)((long)((this->pll_).offset_history_._M_elems + -1) + lVar1) = 1;
    *(undefined8 *)((long)(this->pll_).offset_history_._M_elems + lVar1 + -8) = 1;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x100);
  (this->pll_).offset_history_pointer_ = 0;
  (this->pll_).total_spacing_ = 0xf;
  (this->pll_).total_divisor_ = 0xf;
  (this->pll_).phase_ = 0;
  (this->pll_).window_length_ = 400;
  (this->pll_).offset_ = 0;
  (this->pll_).window_was_filled_ = false;
  (this->pll_).clocks_per_bit_ = 400;
  this->was_high_ = false;
  this->input_pattern_ = 0;
  this->delegate_ = (Delegate *)0x0;
  return;
}

Assistant:

DigitalPhaseLockedLoop(int clocks_per_bit, BitHandler &handler) :
			bit_handler_(handler), window_length_(clocks_per_bit), clocks_per_bit_(clocks_per_bit) {}